

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O0

uint32_t __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<6>::GetAxis
          (DynamicIntegerPointsKdTreeDecoder<6> *this,uint32_t num_remaining_points,
          VectorUint32 *levels,uint32_t last_axis)

{
  uint uVar1;
  const_reference pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  uint in_ESI;
  uint32_t *in_RDI;
  int unaff_retaddr;
  DirectBitDecoder *in_stack_00000008;
  uint32_t axis;
  uint32_t best_axis;
  uint local_24;
  uint32_t local_20;
  
  local_20 = 0;
  if (in_ESI < 0x40) {
    for (local_24 = 1; local_24 < in_RDI[3]; local_24 = local_24 + 1) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDX,(ulong)local_20);
      uVar1 = *pvVar2;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDX,(ulong)local_24);
      if (*pvVar2 < uVar1) {
        local_20 = local_24;
      }
    }
  }
  else {
    DirectBitDecoder::DecodeLeastSignificantBits32(in_stack_00000008,unaff_retaddr,in_RDI);
  }
  return local_20;
}

Assistant:

uint32_t DynamicIntegerPointsKdTreeDecoder<compression_level_t>::GetAxis(
    uint32_t num_remaining_points, const VectorUint32 &levels,
    uint32_t last_axis) {
  if (!Policy::select_axis) {
    return DRACO_INCREMENT_MOD(last_axis, dimension_);
  }

  uint32_t best_axis = 0;
  if (num_remaining_points < 64) {
    for (uint32_t axis = 1; axis < dimension_; ++axis) {
      if (levels[best_axis] > levels[axis]) {
        best_axis = axis;
      }
    }
  } else {
    axis_decoder_.DecodeLeastSignificantBits32(4, &best_axis);
  }

  return best_axis;
}